

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  Shader *this_00;
  size_type sVar1;
  reference ppSVar2;
  ShaderProgram *local_38;
  int local_18;
  int local_14;
  int shaderNdx;
  int shaderType;
  ShaderProgram *this_local;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    local_18 = 0;
    while( true ) {
      sVar1 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::size
                        (this->m_shaders + local_14);
      if ((int)sVar1 <= local_18) break;
      ppSVar2 = std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::operator[]
                          (this->m_shaders + local_14,(long)local_18);
      this_00 = *ppSVar2;
      if (this_00 != (Shader *)0x0) {
        Shader::~Shader(this_00);
        operator_delete(this_00,0x68);
      }
      local_18 = local_18 + 1;
    }
  }
  glu::Program::~Program(&this->m_program);
  local_38 = (ShaderProgram *)&this->m_program;
  do {
    local_38 = (ShaderProgram *)((long)&local_38[-1].m_program.m_info.infoLog.field_2 + 8);
    std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::~vector
              ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)local_38);
  } while (local_38 != this);
  return;
}

Assistant:

ShaderProgram::~ShaderProgram (void)
{
	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
			delete m_shaders[shaderType][shaderNdx];
}